

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuttonChenAdapter.cpp
# Opt level: O0

SCAtypeParameters * __thiscall
OpenMD::SuttonChenAdapter::getSuttonChenParam(SuttonChenAdapter *this)

{
  bool bVar1;
  undefined8 uVar2;
  element_type *this_00;
  SCAtypeParameters *__src;
  SCAtypeParameters *in_RDI;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>_> scData;
  shared_ptr<OpenMD::GenericData> data;
  AtomType *in_stack_ffffffffffffff28;
  shared_ptr<OpenMD::GenericData> *in_stack_ffffffffffffff30;
  string *psVar3;
  string *in_stack_ffffffffffffff40;
  errorStruct *in_stack_ffffffffffffff48;
  string local_98 [64];
  string local_58 [48];
  string local_28 [40];
  
  bVar1 = isSuttonChen((SuttonChenAdapter *)0x2c9eeb);
  if (!bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "SuttonChenAdapter::getSuttonChenParam was passed an atomType (%s)\n\tthat does not appear to be a Sutton-Chen atom.\n"
             ,uVar2);
    std::__cxx11::string::~string(local_28);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  bVar1 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    psVar3 = local_58;
    uVar2 = std::__cxx11::string::c_str();
    in_stack_ffffffffffffff48 = &painCave;
    snprintf(painCave.errMsg,2000,
             "SuttonChenAdapter::getSuttonChenParam could not find Sutton-Chen\n\tparameters for atomType %s.\n"
             ,uVar2);
    std::__cxx11::string::~string(psVar3);
    *(undefined4 *)((long)in_stack_ffffffffffffff48->errMsg + 0x7d4) = 1;
    *(undefined4 *)((long)in_stack_ffffffffffffff48->errMsg + 2000) = 1;
    simError();
  }
  std::dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>,OpenMD::GenericData>
            ((shared_ptr<OpenMD::GenericData> *)in_stack_ffffffffffffff48);
  bVar1 = std::operator==((shared_ptr<OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>_> *)
                          in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    psVar3 = local_98;
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "SuttonChenAdapter::getSuttonChenParam could not convert\n\tGenericData to SCAtypeData for atom type %s\n"
             ,uVar2);
    std::__cxx11::string::~string(psVar3);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  this_00 = std::
            __shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2ca0e0);
  __src = SimpleTypeData<OpenMD::SCAtypeParameters>::getData(this_00);
  memcpy(in_RDI,__src,0x28);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>_> *)0x2ca10b);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x2ca118);
  return in_RDI;
}

Assistant:

SCAtypeParameters SuttonChenAdapter::getSuttonChenParam() {
    if (!isSuttonChen()) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "SuttonChenAdapter::getSuttonChenParam was passed an atomType (%s)\n"
          "\tthat does not appear to be a Sutton-Chen atom.\n",
          at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(SCtypeID);
    if (data == nullptr) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "SuttonChenAdapter::getSuttonChenParam could not find Sutton-Chen\n"
          "\tparameters for atomType %s.\n",
          at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<SCAtypeData> scData =
        std::dynamic_pointer_cast<SCAtypeData>(data);
    if (scData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SuttonChenAdapter::getSuttonChenParam could not convert\n"
               "\tGenericData to SCAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return scData->getData();
  }